

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx.cpp
# Opt level: O1

void __thiscall
ncnn::ConvolutionDepthWise_x86_avx::ConvolutionDepthWise_x86_avx
          (ConvolutionDepthWise_x86_avx *this,void **vtt)

{
  _func_int **pp_Var1;
  undefined1 auVar2 [32];
  
  pp_Var1 = (_func_int **)*vtt;
  this->_vptr_ConvolutionDepthWise_x86_avx = pp_Var1;
  *(void **)((long)&this->_vptr_ConvolutionDepthWise_x86_avx + (long)pp_Var1[-3]) = vtt[1];
  (this->weight_data_packed).w = 0;
  (this->weight_data_packed).h = 0;
  (this->weight_data_packed).d = 0;
  (this->weight_data_packed).c = 0;
  (this->weight_data_packed).allocator = (Allocator *)0x0;
  (this->weight_data_packed).dims = 0;
  (this->weight_data_packed).w = 0;
  (this->weight_data_int8).cstep = 0;
  (this->weight_data_int8).allocator = (Allocator *)0x0;
  (this->weight_data_int8).dims = 0;
  (this->weight_data_int8).w = 0;
  (this->weight_data_int8).w = 0;
  (this->weight_data_int8).h = 0;
  (this->weight_data_int8).d = 0;
  (this->weight_data_int8).c = 0;
  auVar2 = ZEXT432(0) << 0x40;
  this->group_ops = (vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)auVar2._0_24_;
  (this->weight_data_packed).data = (void *)auVar2._24_8_;
  *(undefined1 (*) [32])
   ((long)&(this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = auVar2;
  *(undefined1 (*) [32])&(this->weight_data_packed).cstep = ZEXT432(0) << 0x40;
  (this->weight_data_int8).elempack = 0;
  *(code *)((long)&this->activation + (long)(this->_vptr_ConvolutionDepthWise_x86_avx[-3] + 3)) =
       (code)0x1;
  this->activation = (Layer *)0x0;
  return;
}

Assistant:

ConvolutionDepthWise_x86_avx::ConvolutionDepthWise_x86_avx()
{
#if __SSE2__
    support_packing = true;
#if __AVX2__
    support_weight_fp16_storage = true;
#endif
#endif // __SSE2__
    activation = 0;
}